

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

exr_result_t
internal_huf_compress
          (uint64_t *encbytes,void *out,uint64_t outsz,uint16_t *raw,uint64_t nRaw,void *spare,
          uint64_t sparebytes)

{
  uint64_t **first;
  long *plVar1;
  ushort uVar2;
  int iVar3;
  exr_result_t eVar4;
  uint64_t *puVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint64_t i;
  uint64_t uVar10;
  uint uVar11;
  size_t holeIndex;
  ulong uVar12;
  uint8_t *outend;
  uint64_t i_1;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  int local_a4;
  uint64_t **local_a0;
  uint64_t c;
  uint8_t *local_90;
  uint8_t *local_88;
  uint16_t *local_80;
  ulong local_78;
  uint8_t *local_70;
  uint64_t *local_68;
  uint64_t *local_60;
  ulong local_58;
  undefined1 *local_50;
  uint64_t *local_48;
  uint64_t local_40;
  ulong local_38;
  
  if (nRaw == 0) {
    *encbytes = 0;
  }
  else {
    if (sparebytes != 0x1c001c || outsz < 0x14) {
      return 3;
    }
    local_70 = (uint8_t *)((long)out + 0x14);
    local_88 = (uint8_t *)(outsz + (long)out);
    first = (uint64_t **)((long)spare + 0x100010);
    local_80 = raw;
    local_50 = (undefined1 *)out;
    local_48 = encbytes;
    memset(spare,0,0x80008);
    for (uVar10 = 0; nRaw != uVar10; uVar10 = uVar10 + 1) {
      plVar1 = (long *)((long)spare + (ulong)local_80[uVar10] * 8);
      *plVar1 = *plVar1 + 1;
    }
    local_68 = (uint64_t *)((long)spare + 0x80008);
    local_78 = 0xffffffffffffffff;
    do {
      local_78 = (ulong)((int)local_78 + 1);
    } while (*(long *)((long)spare + local_78 * 8) == 0);
    puVar5 = (uint64_t *)((long)spare + local_78 * 8);
    uVar13 = 0;
    uVar12 = 0;
    for (uVar6 = local_78; uVar6 < 0x10001; uVar6 = uVar6 + 1) {
      *(int *)((long)spare + uVar6 * 4 + 0x180018) = (int)uVar6;
      if (*puVar5 != 0) {
        first[uVar12] = puVar5;
        uVar12 = (ulong)((int)uVar12 + 1);
        uVar13 = uVar6 & 0xffffffff;
      }
      puVar5 = puVar5 + 1;
    }
    local_58 = (ulong)((int)uVar13 + 1);
    local_60 = (uint64_t *)((long)spare + local_58 * 8);
    *local_60 = 1;
    *(uint64_t **)((long)spare + uVar12 * 8 + 0x100010) = local_60;
    uVar9 = (int)uVar12 + 1;
    uVar6 = (ulong)uVar9;
    local_40 = nRaw;
    if (1 < uVar9) {
      holeIndex = uVar6 - 2 >> 1;
      do {
        adjust_heap(first,holeIndex,uVar6,first[holeIndex]);
        bVar16 = holeIndex != 0;
        holeIndex = holeIndex - 1;
      } while (bVar16);
    }
    memset(local_68,0,0x80008);
    local_a0 = first;
    while (puVar5 = local_68, 1 < uVar6) {
      uVar14 = *(long *)((long)spare + 0x100010) - (long)spare;
      uVar13 = uVar14 >> 3;
      pop_heap(local_a0,local_a0 + uVar6);
      local_38 = uVar6 - 1;
      uVar15 = *(long *)((long)spare + 0x100010) - (long)spare;
      uVar12 = uVar15 >> 3;
      pop_heap(local_a0,local_a0 + (uVar6 - 1));
      plVar1 = (long *)((long)spare + (uVar15 & 0x7fffffff8));
      *plVar1 = *plVar1 + *(long *)((long)spare + (uVar14 & 0x7fffffff8));
      intern_push_heap(local_a0,uVar6 - 2,0,*(uint64_t **)((long)spare + uVar6 * 8 + 0x100000));
      do {
        uVar11 = (uint)uVar12;
        uVar6 = uVar12 & 0xffffffff;
        plVar1 = (long *)((long)spare + uVar6 * 8 + 0x80008);
        *plVar1 = *plVar1 + 1;
        uVar9 = *(uint *)((long)spare + uVar6 * 4 + 0x180018);
        uVar12 = (ulong)uVar9;
      } while (uVar9 != uVar11);
      *(int *)((long)spare + uVar6 * 4 + 0x180018) = (int)uVar13;
      do {
        uVar11 = (uint)uVar13;
        plVar1 = (long *)((long)spare + (uVar13 & 0xffffffff) * 8 + 0x80008);
        *plVar1 = *plVar1 + 1;
        uVar9 = *(uint *)((long)spare + (uVar13 & 0xffffffff) * 4 + 0x180018);
        uVar13 = (ulong)uVar9;
        uVar6 = local_38;
      } while (uVar9 != uVar11);
    }
    hufCanonicalCodeTable(local_68);
    memcpy(spare,puVar5,0x80008);
    local_90 = local_70;
    c = 0;
    local_a4 = 0;
    uVar6 = local_78 & 0xffffffff;
    while( true ) {
      uVar9 = (uint)uVar6;
      if ((uint)local_58 < uVar9) break;
      uVar12 = *(ulong *)((long)spare + uVar6 * 8) & 0x3f;
      if (uVar12 == 0) {
        uVar10 = 0xfffffffffffffffb;
        while (((uVar13 = uVar10 + 6, uVar6 < local_58 && (uVar13 < 0x105)) &&
               ((*(byte *)((long)spare + uVar6 * 8 + 8) & 0x3f) == 0))) {
          uVar10 = uVar10 + 1;
          uVar6 = uVar6 + 1;
        }
        uVar9 = (uint)uVar6;
        if (uVar13 < 2) goto LAB_0010bd53;
        if (uVar13 < 6) {
          iVar3 = outputBits(6,uVar10 + 0x3f,&c,&local_a4,&local_90,local_88);
        }
        else {
          eVar4 = outputBits(6,0x3f,&c,&local_a4,&local_90,local_88);
          if (eVar4 != 0) {
            return eVar4;
          }
          iVar3 = outputBits(8,uVar10,&c,&local_a4,&local_90,local_88);
        }
      }
      else {
LAB_0010bd53:
        iVar3 = outputBits(6,uVar12,&c,&local_a4,&local_90,local_88);
      }
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar6 = (ulong)(uVar9 + 1);
    }
    if (0 < local_a4) {
      if (local_88 <= local_90) {
        return 4;
      }
      *local_90 = (uint8_t)(c << (8U - (char)local_a4 & 0x3f));
      local_90 = local_90 + 1;
    }
    c = 0;
    local_a4 = 0;
    uVar6 = 1;
    iVar3 = 0;
    outend = local_88;
    local_a0 = (uint64_t **)local_90;
    while( true ) {
      uVar2 = local_80[uVar6 - 1];
      if (local_40 <= uVar6) break;
      if (iVar3 < 0xff && uVar2 == local_80[uVar6]) {
        iVar3 = iVar3 + 1;
      }
      else {
        eVar4 = sendCode(*(uint64_t *)((long)spare + (ulong)uVar2 * 8),iVar3,*local_60,&c,&local_a4,
                         &local_90,outend);
        iVar3 = 0;
        outend = local_88;
        if (eVar4 != 0) {
          return eVar4;
        }
      }
      uVar6 = uVar6 + 1;
    }
    eVar4 = sendCode(*(uint64_t *)((long)spare + (ulong)uVar2 * 8),iVar3,*local_60,&c,&local_a4,
                     &local_90,outend);
    if (eVar4 != 0) {
      return eVar4;
    }
    if (local_a4 != 0) {
      if (local_88 <= local_90) {
        return 4;
      }
      *local_90 = (uint8_t)(c << (8U - (char)local_a4 & 0x3f));
    }
    *local_50 = (char)local_78;
    local_50[1] = (char)(local_78 >> 8);
    local_50[2] = (char)(local_78 >> 0x10);
    local_50[3] = (char)(local_78 >> 0x18);
    iVar8 = (int)local_90 - (int)local_a0;
    local_50[4] = (char)local_58;
    local_50[5] = (char)(local_58 >> 8);
    local_50[6] = (char)(local_58 >> 0x10);
    local_50[7] = (char)(local_58 >> 0x18);
    lVar7 = (long)local_a0 - (long)local_70;
    local_50[8] = (char)lVar7;
    local_50[9] = (char)((ulong)lVar7 >> 8);
    local_50[10] = (char)((ulong)lVar7 >> 0x10);
    local_50[0xb] = (char)((ulong)lVar7 >> 0x18);
    iVar3 = local_a4 + iVar8 * 8;
    local_50[0xc] = (char)iVar3;
    local_50[0xd] = (char)((uint)iVar3 >> 8);
    local_50[0xe] = (char)((uint)iVar3 >> 0x10);
    local_50[0xf] = (char)((uint)iVar3 >> 0x18);
    *(undefined4 *)(local_50 + 0x10) = 0;
    *local_48 = (uint64_t)
                ((long)local_a0 + ((ulong)(local_a4 + iVar8 * 8 + 7U >> 3) - (long)local_50));
  }
  return 0;
}

Assistant:

exr_result_t
internal_huf_compress (
    uint64_t*       encbytes,
    void*           out,
    uint64_t        outsz,
    const uint16_t* raw,
    uint64_t        nRaw,
    void*           spare,
    uint64_t        sparebytes)
{
    exr_result_t rv;
    uint64_t*  freq;
    uint32_t*  hlink;
    uint64_t** fHeap;
    uint64_t*  scode;
    uint32_t   im = 0;
    uint32_t   iM = 0;
    uint32_t   tableLength, nBits, dataLength;
    uint8_t*   dataStart;
    uint8_t*   compressed = (uint8_t*) out;
    uint8_t*   tableStart = compressed + 20;
    uint8_t*   tableEnd   = tableStart;
    uint8_t*   maxcompout = compressed + outsz;

    if (nRaw == 0)
    {
        *encbytes = 0;
        return EXR_ERR_SUCCESS;
    }

    if (outsz < 20)
        return EXR_ERR_INVALID_ARGUMENT;
    if (sparebytes != internal_exr_huf_compress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    freq  = (uint64_t*) spare;
    scode = freq + HUF_ENCSIZE;
    fHeap = (uint64_t**) (scode + HUF_ENCSIZE);
    hlink = (uint32_t*) (fHeap + HUF_ENCSIZE);

    countFrequencies (freq, raw, nRaw);

    hufBuildEncTable (freq, &im, &iM, hlink, fHeap, scode);

    rv = hufPackEncTable (freq, im, iM, &tableEnd, maxcompout);

    if (rv != EXR_ERR_SUCCESS) return rv;
    tableLength =
        (uint32_t) (((uintptr_t) tableEnd) - ((uintptr_t) tableStart));
    dataStart = tableEnd;

    rv = hufEncode (freq, raw, nRaw, iM, dataStart, maxcompout, &nBits);
    if (rv != EXR_ERR_SUCCESS) return rv;

    dataLength = (nBits + 7) / 8;

    writeUInt (compressed, im);
    writeUInt (compressed + 4, iM);
    writeUInt (compressed + 8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0); // room for future extensions

    *encbytes =
        (((uintptr_t) dataStart) + ((uintptr_t) dataLength) -
         ((uintptr_t) compressed));
    return EXR_ERR_SUCCESS;
}